

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.cpp
# Opt level: O0

string * rlib::sequencer::MmlCompiler::Exception::getMessage_abi_cxx11_(Code code)

{
  initializer_list<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  iterator in_RDI;
  const_iterator i;
  map<rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<rlib::sequencer::MmlCompiler::Exception::Code>,_std::allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff6d8;
  char (*in_stack_fffffffffffff700) [88];
  Code *in_stack_fffffffffffff708;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff710;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff718;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff720;
  less<rlib::sequencer::MmlCompiler::Exception::Code> *__comp;
  iterator ppVar4;
  size_type in_stack_fffffffffffff740;
  _Self local_8b8;
  _Self local_8b0;
  less<rlib::sequencer::MmlCompiler::Exception::Code> local_8a6 [2];
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined4 local_864;
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7d4;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_7d0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7c8;
  undefined1 local_7a0 [40];
  undefined1 local_778 [40];
  undefined1 local_750 [40];
  undefined1 local_728 [40];
  undefined1 local_700 [40];
  undefined1 local_6d8 [40];
  undefined1 local_6b0 [40];
  undefined1 local_688 [40];
  undefined1 local_660 [40];
  undefined1 local_638 [40];
  undefined1 local_610 [40];
  undefined1 local_5e8 [40];
  undefined1 local_5c0 [40];
  undefined1 local_598 [40];
  undefined1 local_570 [40];
  undefined1 local_548 [40];
  undefined1 local_520 [40];
  undefined1 local_4f8 [40];
  undefined1 local_4d0 [40];
  undefined1 local_4a8 [40];
  undefined1 local_480 [40];
  undefined1 local_458 [40];
  undefined1 local_430 [40];
  undefined1 local_408 [40];
  undefined1 local_3e0 [40];
  undefined1 local_3b8 [40];
  undefined1 local_390 [40];
  undefined1 local_368 [40];
  undefined1 local_340 [40];
  undefined1 local_318 [40];
  undefined1 local_2f0 [40];
  undefined1 local_2c8 [40];
  undefined1 local_2a0 [40];
  undefined1 local_278 [40];
  undefined1 local_250 [40];
  undefined1 local_228 [40];
  undefined1 local_200 [40];
  undefined1 local_1d8 [40];
  undefined1 local_1b0 [40];
  undefined1 local_188 [40];
  undefined1 local_160 [40];
  undefined1 local_138 [40];
  undefined1 local_110 [40];
  undefined1 local_e8 [40];
  undefined1 local_c0 [40];
  undefined1 local_98 [40];
  undefined1 local_70 [40];
  undefined1 local_48 [40];
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  _Alloc_hider local_18;
  undefined7 uStack_17;
  
  ppVar4 = in_RDI;
  if (getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::m_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)
                                 ::m_abi_cxx11_);
    if (iVar2 != 0) {
      local_7d0 = &local_7c8;
      local_7d4 = 1;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[40],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [40])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_7a0;
      local_7e8 = 2;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[37],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [37])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_778;
      local_7ec = 3;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[43],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [43])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_750;
      local_7f0 = 4;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[46],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [46])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_728;
      local_7f4 = 5;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[43],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [43])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_700;
      local_7f8 = 6;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[43],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [43])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_6d8;
      local_7fc = 7;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[40],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [40])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_6b0;
      local_800 = 8;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[66],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [66])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_688;
      local_804 = 9;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[66],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [66])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_660;
      local_808 = 10;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[72],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [72])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_638;
      local_80c = 0xb;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[66],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [66])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_610;
      local_810 = 0xc;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[66],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [66])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_5e8;
      local_814 = 0xd;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[60],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [60])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_5c0;
      local_818 = 0xe;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[57],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [57])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_598;
      local_81c = 0xf;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[57],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [57])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_570;
      local_820 = 0x10;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[61],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [61])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_548;
      local_824 = 0x11;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[83],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [83])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_520;
      local_828 = 0x12;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[37],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [37])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_4f8;
      local_82c = 0x13;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[51],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [51])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_4d0;
      local_830 = 0x14;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[48],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [48])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_4a8;
      local_834 = 0x15;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[69],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [69])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_480;
      local_838 = 0x16;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[63],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [63])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_458;
      local_83c = 0x17;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[72],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [72])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_430;
      local_840 = 0x18;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[42],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [42])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_408;
      local_844 = 0x19;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[63],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [63])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_3e0;
      local_848 = 0x1a;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[53],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [53])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_3b8;
      local_84c = 0x1b;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[44],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [44])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_390;
      local_850 = 0x1c;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[50],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [50])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_368;
      local_854 = 0x1d;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[41],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [41])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_340;
      local_858 = 0x1e;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[56],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [56])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_318;
      local_85c = 0x1f;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[47],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [47])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_2f0;
      local_860 = 0x20;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[60],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [60])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_2c8;
      local_864 = 0x21;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[51],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [51])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_2a0;
      local_868 = 0x22;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[52],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [52])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_278;
      local_86c = 0x23;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[61],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [61])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_250;
      local_870 = 0x24;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[67],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [67])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_228;
      local_874 = 0x25;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[46],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [46])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_200;
      local_878 = 0x26;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[61],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [61])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1d8;
      local_87c = 0x27;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[42],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [42])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1b0;
      local_880 = 0x28;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[60],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [60])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_188;
      local_884 = 0x29;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[55],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [55])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_160;
      local_888 = 0x2a;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[46],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [46])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_138;
      local_88c = 0x2b;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[57],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [57])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_110;
      local_890 = 0x2c;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[48],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [48])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_e8;
      local_894 = 0x2d;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[52],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [52])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0;
      local_898 = 0x2e;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[88],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_98;
      local_89c = 0x2f;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[52],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [52])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_70;
      local_8a0 = 0x30;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[31],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [31])in_stack_fffffffffffff700);
      local_7d0 = (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_48;
      local_8a4 = 0x31;
      std::
      pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[30],_true>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                 (char (*) [30])in_stack_fffffffffffff700);
      local_20 = &local_7c8;
      local_18 = (_Alloc_hider)0x31;
      uStack_17 = 0;
      __comp = local_8a6;
      std::
      allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x15d394);
      __l._M_len = in_stack_fffffffffffff740;
      __l._M_array = ppVar4;
      std::
      map<rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<rlib::sequencer::MmlCompiler::Exception::Code>,_std::allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<rlib::sequencer::MmlCompiler::Exception::Code>,_std::allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_RDI,__l,__comp,(allocator_type *)in_stack_fffffffffffff720);
      std::
      allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x15d3cc);
      in_stack_fffffffffffff718 = &local_7c8;
      in_stack_fffffffffffff710 =
           (pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_20;
      do {
        in_stack_fffffffffffff710 = in_stack_fffffffffffff710 + -1;
        std::
        pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x15d3f7);
      } while (in_stack_fffffffffffff710 != in_stack_fffffffffffff718);
      in_stack_fffffffffffff720 = in_stack_fffffffffffff710;
      __cxa_atexit(std::
                   map<rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<rlib::sequencer::MmlCompiler::Exception::Code>,_std::allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::
                           m_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::
                           m_abi_cxx11_);
    }
  }
  local_8b0._M_node =
       (_Base_ptr)
       std::
       map<rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<rlib::sequencer::MmlCompiler::Exception::Code>,_std::allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffff6d8,(key_type *)0x15d445);
  local_8b8._M_node =
       (_Base_ptr)
       std::
       map<rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<rlib::sequencer::MmlCompiler::Exception::Code>,_std::allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffff6d8);
  bVar1 = std::operator!=(&local_8b0,&local_8b8);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x15d47d);
    std::__cxx11::string::string((string *)in_RDI,(string *)&ppVar3->second);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff720,(char *)in_stack_fffffffffffff718,
               (allocator<char> *)in_stack_fffffffffffff710);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff747);
  }
  return (string *)ppVar4;
}

Assistant:

std::string MmlCompiler::Exception::getMessage(Code code) {
	static const std::map<Code, std::string> m = {
		{Code::lengthError,						u8R"(音長の指定に誤りがあります)"},
		{Code::lengthMinusError,				u8R"(音長を負値にはできません)"},
		{Code::commentError,					u8R"(コメント指定に誤りがあります)"},
		{Code::argumentError,					u8R"(関数の引数指定に誤りがあります)"},
		{Code::argumentUnknownError,			u8R"(関数に不明な引数名があります)"},
		{Code::functionCallError,				u8R"(関数呼び出しに誤りがあります)"},
		{Code::unknownNumberError,				u8R"(数値の指定に誤りがあります)"},
		{Code::vCommandError,					u8R"(ベロシティ指定（v コマンド）に誤りがあります)"},
		{Code::vCommandRangeError,				u8R"(ベロシティ指定（v コマンド）の値が範囲外です)"},
		{Code::lCommandError,					u8R"(デフォルト音長指定（l コマンド）に誤りがあります)"},
		{Code::oCommandError,					u8R"(オクターブ指定（o コマンド）に誤りがあります)"},
		{Code::oCommandRangeError,				u8R"(オクターブ指定（o コマンド）の値が範囲外です)"},
		{Code::tCommandRangeError,				u8R"(テンポ指定（t コマンド）に誤りがあります)"},
		{Code::programchangeCommandError,		u8R"(音色指定（@ コマンド）に誤りがあります)"},
		{Code::rCommandRangeError,				u8R"(休符指定（r コマンド）に誤りがあります)"},
		{Code::noteCommandRangeError,			u8R"(音符指定（a～g コマンド）に誤りがあります)"},
		{Code::octaveUpDownCommandError,		u8R"(オクターブアップダウン（ < , > コマンド）に誤りがあります)"},
		{Code::octaveUpDownRangeCommandError,	u8R"(オクターブ値が範囲外です)" },
		{Code::tieCommandError,					u8R"(タイ（^ コマンド）に誤りがあります)"},
		{Code::createPortError,					u8R"(CreatePort コマンドに誤りがあります)"},
		{Code::createPortPortNameError,			u8R"(CreatePort コマンドのポート名指定に誤りがあります)"},
		{Code::createPortDuplicateError,		u8R"(CreatePort コマンドでポート名が重複しています)" },
		{Code::createPortChannelError,			u8R"(CreatePort コマンドのチャンネル指定に誤りがあります)" },
		{Code::portError,						u8R"(Port コマンドに誤りがあります)" },
		{Code::portNameError,					u8R"(Port コマンドのポート名指定に誤りがあります)" },
		{Code::volumeError,						u8R"(Volume コマンドの指定に誤りがあります)" },
		{Code::volumeRangeError,				u8R"(Volume コマンドの値が範囲外です)" },
		{Code::panError,						u8R"(Pan コマンドの指定に誤りがあります)" },
		{Code::panRangeError,					u8R"(Pan コマンドの値が範囲外です)" },
		{Code::pitchBendError,					u8R"(PitchBend コマンドの指定に誤りがあります)" },
		{Code::pitchBendRangeError,				u8R"(PitchBend コマンドの値が範囲外です)" },
		{Code::controlChangeError,				u8R"(ControlChange コマンドの指定に誤りがあります)" },
		{Code::controlChangeRangeError,			u8R"(ControlChange コマンドの値が範囲外です)" },
		{Code::createSequenceError,				u8R"(CreateSequence コマンドに誤りがあります)" },
		{Code::createSequenceDuplicateError,	u8R"(CreateSequence コマンドで名前が重複しています)" },
		{Code::createSequenceNameError,			u8R"(CreateSequence コマンドの名前指定に誤りがあります)" },
		{Code::sequenceError,					u8R"(Sequence コマンドに誤りがあります)" },
		{Code::sequenceNameError,				u8R"(Sequence コマンドの名前指定に誤りがあります)" },
		{Code::metaError,						u8R"(Meta コマンドに誤りがあります)" },
		{Code::metaTypeError,					u8R"(Meta コマンドの type の指定に誤りがあります)" },
		{Code::fineTuneError,					u8R"(FineTune コマンドの指定に誤りがあります)" },
		{Code::fineTuneRangeError,				u8R"(FineTune コマンドの値が範囲外です)" },
		{Code::coarseTuneError,					u8R"(CoarseTune コマンドの指定に誤りがあります)" },
		{Code::coarseTuneRangeError,			u8R"(CoarseTune コマンドの値が範囲外です)" },
		{Code::definePresetFMError,				u8R"(DefinePresetFM コマンドに誤りがあります)" },
		{Code::definePresetFMNoError,			u8R"(DefinePresetFM コマンドのプログラムナンバー指定に誤りがあります)" },
		{Code::definePresetFMRangeError,		u8R"(DefinePresetFM コマンドの値が範囲外です)" },
		{Code::unknownError,					u8R"(解析出来ない書式です)"},
		{Code::stdEexceptionError,				u8R"(std::excption エラーです)"},
	};
	if (auto i = m.find(code); i != m.end()) {
		return i->second;
	}
	assert(false);
	return "unknown";
}